

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subscr_storage_map_based.cpp
# Opt level: O0

void __thiscall
so_5::impl::map_based_subscr_storage::storage_t::destroy_all_subscriptions(storage_t *this)

{
  bool bVar1;
  pointer ppVar2;
  abstract_message_box_t *paVar3;
  agent_t *paVar4;
  byte local_59;
  mbox_id_t local_40;
  type_index *local_38;
  _Self local_30;
  _Rb_tree_iterator<std::pair<const_so_5::impl::map_based_subscr_storage::storage_t::key_t,_so_5::impl::map_based_subscr_storage::storage_t::value_t>_>
  local_28;
  _Self cur;
  _Self local_18;
  iterator it;
  storage_t *this_local;
  
  it._M_node = (_Base_ptr)this;
  local_18._M_node =
       (_Base_ptr)
       std::
       begin<std::map<so_5::impl::map_based_subscr_storage::storage_t::key_t,so_5::impl::map_based_subscr_storage::storage_t::value_t,std::less<so_5::impl::map_based_subscr_storage::storage_t::key_t>,std::allocator<std::pair<so_5::impl::map_based_subscr_storage::storage_t::key_t_const,so_5::impl::map_based_subscr_storage::storage_t::value_t>>>>
                 (&this->m_events);
  while( true ) {
    cur._M_node = (_Base_ptr)
                  std::
                  end<std::map<so_5::impl::map_based_subscr_storage::storage_t::key_t,so_5::impl::map_based_subscr_storage::storage_t::value_t,std::less<so_5::impl::map_based_subscr_storage::storage_t::key_t>,std::allocator<std::pair<so_5::impl::map_based_subscr_storage::storage_t::key_t_const,so_5::impl::map_based_subscr_storage::storage_t::value_t>>>>
                            (&this->m_events);
    bVar1 = std::operator!=(&local_18,&cur);
    if (!bVar1) break;
    local_28._M_node =
         (_Base_ptr)
         std::
         _Rb_tree_iterator<std::pair<const_so_5::impl::map_based_subscr_storage::storage_t::key_t,_so_5::impl::map_based_subscr_storage::storage_t::value_t>_>
         ::operator++(&local_18,0);
    local_30._M_node =
         (_Base_ptr)
         std::
         end<std::map<so_5::impl::map_based_subscr_storage::storage_t::key_t,so_5::impl::map_based_subscr_storage::storage_t::value_t,std::less<so_5::impl::map_based_subscr_storage::storage_t::key_t>,std::allocator<std::pair<so_5::impl::map_based_subscr_storage::storage_t::key_t_const,so_5::impl::map_based_subscr_storage::storage_t::value_t>>>>
                   (&this->m_events);
    bVar1 = std::operator==(&local_18,&local_30);
    local_59 = 1;
    if (!bVar1) {
      ppVar2 = std::
               _Rb_tree_iterator<std::pair<const_so_5::impl::map_based_subscr_storage::storage_t::key_t,_so_5::impl::map_based_subscr_storage::storage_t::value_t>_>
               ::operator->(&local_28);
      local_40 = (ppVar2->first).m_mbox_id;
      ppVar2 = std::
               _Rb_tree_iterator<std::pair<const_so_5::impl::map_based_subscr_storage::storage_t::key_t,_so_5::impl::map_based_subscr_storage::storage_t::value_t>_>
               ::operator->(&local_28);
      local_38 = &(ppVar2->first).m_msg_type;
      ppVar2 = std::
               _Rb_tree_iterator<std::pair<const_so_5::impl::map_based_subscr_storage::storage_t::key_t,_so_5::impl::map_based_subscr_storage::storage_t::value_t>_>
               ::operator->(&local_18);
      bVar1 = map_based_subscr_storage::(anonymous_namespace)::is_same_mbox_msg::operator()
                        ((is_same_mbox_msg *)&local_40,&ppVar2->first);
      local_59 = bVar1 ^ 0xff;
    }
    if ((local_59 & 1) != 0) {
      ppVar2 = std::
               _Rb_tree_iterator<std::pair<const_so_5::impl::map_based_subscr_storage::storage_t::key_t,_so_5::impl::map_based_subscr_storage::storage_t::value_t>_>
               ::operator->(&local_28);
      paVar3 = intrusive_ptr_t<so_5::abstract_message_box_t>::operator->(&(ppVar2->second).m_mbox);
      ppVar2 = std::
               _Rb_tree_iterator<std::pair<const_so_5::impl::map_based_subscr_storage::storage_t::key_t,_so_5::impl::map_based_subscr_storage::storage_t::value_t>_>
               ::operator->(&local_28);
      paVar4 = subscription_storage_t::owner(&this->super_subscription_storage_t);
      (*paVar3->_vptr_abstract_message_box_t[4])(paVar3,&(ppVar2->first).m_msg_type,paVar4);
    }
    std::
    map<so_5::impl::map_based_subscr_storage::storage_t::key_t,so_5::impl::map_based_subscr_storage::storage_t::value_t,std::less<so_5::impl::map_based_subscr_storage::storage_t::key_t>,std::allocator<std::pair<so_5::impl::map_based_subscr_storage::storage_t::key_t_const,so_5::impl::map_based_subscr_storage::storage_t::value_t>>>
    ::erase_abi_cxx11_((map<so_5::impl::map_based_subscr_storage::storage_t::key_t,so_5::impl::map_based_subscr_storage::storage_t::value_t,std::less<so_5::impl::map_based_subscr_storage::storage_t::key_t>,std::allocator<std::pair<so_5::impl::map_based_subscr_storage::storage_t::key_t_const,so_5::impl::map_based_subscr_storage::storage_t::value_t>>>
                        *)&this->m_events,(iterator)local_28._M_node);
  }
  return;
}

Assistant:

void
storage_t::destroy_all_subscriptions()
	{
		using namespace std;

		auto it = begin( m_events );
		while( it != end( m_events ) )
			{
				auto cur = it++;

				if( it == end( m_events ) || !is_same_mbox_msg{
						cur->first.m_mbox_id,
						cur->first.m_msg_type }( it->first ) )
					{
						cur->second.m_mbox->unsubscribe_event_handlers(
								cur->first.m_msg_type,
								owner() );
					}

				m_events.erase( cur );
			}
	}